

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O1

Instr * __thiscall LowererMD::Simd128LowerStoreElem(LowererMD *this,Instr *instr)

{
  uint8 dataWidth;
  IndirOpnd *indirOpnd;
  RegOpnd *indexOpnd;
  Opnd *src1;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  BYTE scaleFactor;
  uint uVar4;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar5;
  Instr *pIVar6;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType arrType;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar2 = JITTimeFunctionBody::IsAsmJsMode(this_00);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xaf8,"(!m_func->GetJITFunctionBody()->IsAsmJsMode())",
                       "!m_func->GetJITFunctionBody()->IsAsmJsMode()");
    if (!bVar2) goto LAB_006786f9;
    *puVar5 = 0;
  }
  uVar4 = (uint)instr->m_opcode;
  if (instr->m_opcode < Simd128_StArr_U4) {
    if ((0x3f < uVar4 - 0x306) ||
       ((0x8000000000014001U >> ((ulong)(uVar4 - 0x306) & 0x3f) & 1) == 0)) {
LAB_006786a3:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0xb01,
                         "(instr->m_opcode == Js::OpCode::Simd128_StArr_I4 || instr->m_opcode == Js::OpCode::Simd128_StArr_I8 || instr->m_opcode == Js::OpCode::Simd128_StArr_I16 || instr->m_opcode == Js::OpCode::Simd128_StArr_U4 || instr->m_opcode == Js::OpCode::Simd128_StArr_U8 || instr->m_opcode == Js::OpCode::Simd128_StArr_U16 || instr->m_opcode == Js::OpCode::Simd128_StArr_F4)"
                         ,
                         "instr->m_opcode == Js::OpCode::Simd128_StArr_I4 || instr->m_opcode == Js::OpCode::Simd128_StArr_I8 || instr->m_opcode == Js::OpCode::Simd128_StArr_I16 || instr->m_opcode == Js::OpCode::Simd128_StArr_U4 || instr->m_opcode == Js::OpCode::Simd128_StArr_U8 || instr->m_opcode == Js::OpCode::Simd128_StArr_U16 || instr->m_opcode == Js::OpCode::Simd128_StArr_F4"
                        );
      if (!bVar2) goto LAB_006786f9;
      *puVar5 = 0;
    }
  }
  else if (((uVar4 != 0x36b) && (uVar4 != 0x38e)) && (uVar4 != 0x3b1)) goto LAB_006786a3;
  indirOpnd = (IndirOpnd *)instr->m_dst;
  OVar3 = IR::Opnd::GetKind((Opnd *)indirOpnd);
  if (OVar3 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar2) goto LAB_006786f9;
    *puVar5 = 0;
  }
  indexOpnd = indirOpnd->m_indexOpnd;
  src1 = instr->m_src1;
  dataWidth = instr->dataWidth;
  OVar3 = IR::Opnd::GetKind((Opnd *)indirOpnd);
  if (OVar3 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar2) goto LAB_006786f9;
    *puVar5 = 0;
  }
  local_32[0] = (indirOpnd->m_baseOpnd->super_Opnd).m_valueType.field_0;
  bVar2 = ValueType::IsObject((ValueType *)&local_32[0].field_0);
  if (bVar2) {
    bVar2 = ValueType::IsTypedArray((ValueType *)&local_32[0].field_0);
    if (!bVar2) goto LAB_0067850f;
  }
  else {
LAB_0067850f:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xb0a,"(arrType.IsObject() && arrType.IsTypedArray())",
                       "arrType.IsObject() && arrType.IsTypedArray()");
    if (!bVar2) goto LAB_006786f9;
    *puVar5 = 0;
  }
  OVar3 = IR::Opnd::GetKind((Opnd *)indirOpnd);
  if (OVar3 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar2) goto LAB_006786f9;
    *puVar5 = 0;
  }
  Simd128GenerateUpperBoundCheck(this,indexOpnd,indirOpnd,(ValueType)local_32[0].field_0,instr);
  OVar3 = IR::Opnd::GetKind((Opnd *)indirOpnd);
  if (OVar3 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar2) {
LAB_006786f9:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  Simd128LoadHeadSegment(this,indirOpnd,(ValueType)local_32[0].field_0,instr);
  scaleFactor = Lowerer::GetArrayIndirScale((ValueType)local_32[0].field_0);
  pIVar6 = Simd128ConvertToStore(this,(Opnd *)indirOpnd,src1,dataWidth,instr,scaleFactor);
  return pIVar6;
}

Assistant:

IR::Instr*
LowererMD::Simd128LowerStoreElem(IR::Instr *instr)
{
    Assert(!m_func->GetJITFunctionBody()->IsAsmJsMode());
    Assert(
           instr->m_opcode == Js::OpCode::Simd128_StArr_I4 ||
           instr->m_opcode == Js::OpCode::Simd128_StArr_I8 ||
           instr->m_opcode == Js::OpCode::Simd128_StArr_I16 ||
           instr->m_opcode == Js::OpCode::Simd128_StArr_U4 ||
           instr->m_opcode == Js::OpCode::Simd128_StArr_U8 ||
           instr->m_opcode == Js::OpCode::Simd128_StArr_U16 ||
           instr->m_opcode == Js::OpCode::Simd128_StArr_F4
        );

    IR::Opnd * dst = instr->GetDst();
    IR::RegOpnd * indexOpnd = dst->AsIndirOpnd()->GetIndexOpnd();
    IR::Opnd * src1 = instr->GetSrc1();
    uint8 dataWidth = instr->dataWidth;
    ValueType arrType = dst->AsIndirOpnd()->GetBaseOpnd()->GetValueType();

    // If we type-specialized, then array is a definite type-array.
    Assert(arrType.IsObject() && arrType.IsTypedArray());

    Simd128GenerateUpperBoundCheck(indexOpnd, dst->AsIndirOpnd(), arrType, instr);
    Simd128LoadHeadSegment(dst->AsIndirOpnd(), arrType, instr);
    return Simd128ConvertToStore(dst, src1, dataWidth, instr, m_lowerer->GetArrayIndirScale(arrType) /*scale factor*/);
}